

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O1

int __thiscall QOpenGLShaderProgram::link(QOpenGLShaderProgram *this,char *__from,char *__to)

{
  char *pcVar1;
  QOpenGLShaderProgramPrivate *this_00;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  undefined1 *puVar4;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  void *pvVar8;
  undefined8 extraout_RAX;
  undefined7 extraout_var;
  int iVar9;
  storage_type *psVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  GLint len;
  GLint value;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  undefined4 local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QOpenGLShaderProgramPrivate **)&this->field_0x8;
  if (this_00->programGuard == (QOpenGLSharedResourceGuard *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = *(int *)(this_00->programGuard + 0x10);
  }
  if (iVar9 == 0) {
    iVar6 = 0;
  }
  else {
    if (((this_00->linkBinaryRecursion == false) && ((this_00->shaders).d.size == 0)) &&
       ((this_00->binaryProgram).shaders.d.size != 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        bVar5 = QOpenGLShaderProgramPrivate::linkBinary(this_00);
        return (int)CONCAT71(extraout_var,bVar5);
      }
      goto LAB_0014db1f;
    }
    local_3c = -0x55555556;
    if ((this_00->shaders).d.size == 0) {
      local_3c = 0;
      uVar7 = (**(code **)(*(long *)this_00->glfuncs + 0x2a8))(iVar9,0x8b82,&local_3c);
      this_00->linked = local_3c != 0;
      iVar6 = (int)CONCAT71((int7)((ulong)uVar7 >> 8),1);
      if (local_3c != 0) goto LAB_0014da52;
    }
    (**(code **)(*(long *)this_00->glfuncs + 0x338))(iVar9);
    local_3c = 0;
    (**(code **)(*(long *)this_00->glfuncs + 0x2a8))(iVar9,0x8b82,&local_3c);
    this_00->linked = local_3c != 0;
    local_3c = 0;
    uVar7 = (**(code **)(*(long *)this_00->glfuncs + 0x2a8))(iVar9,0x8b84,&local_3c);
    pQVar2 = &((this_00->log).d.d)->super_QArrayData;
    (this_00->log).d.d = (Data *)0x0;
    (this_00->log).d.ptr = (char16_t *)0x0;
    (this_00->log).d.size = 0;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        uVar7 = QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    iVar6 = local_3c;
    if (1 < (long)local_3c) {
      pvVar8 = operator_new__((long)local_3c);
      local_40 = 0xaaaaaaaa;
      (**(code **)(*(long *)this_00->glfuncs + 0x2b0))(iVar9,iVar6,&local_40,pvVar8);
      psVar10 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar10 + (long)pvVar8 + 1;
        psVar10 = psVar10 + 1;
      } while (*pcVar1 != '\0');
      QVar11.m_data = psVar10;
      QVar11.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar11);
      pQVar2 = &((this_00->log).d.d)->super_QArrayData;
      pcVar3 = (this_00->log).d.ptr;
      (this_00->log).d.d = (Data *)local_58;
      (this_00->log).d.ptr = pcStack_50;
      puVar4 = (undefined1 *)(this_00->log).d.size;
      (this_00->log).d.size = (qsizetype)local_48;
      local_58 = pQVar2;
      pcStack_50 = pcVar3;
      local_48 = puVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if ((this_00->linked == false) && (this_00->linkBinaryRecursion == false)) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QObject::objectName();
        if (local_48 == (undefined1 *)0x0) {
          link((char *)&this_00->log,(char *)this);
        }
        else {
          link((char *)&local_58,(char *)&this_00->log);
        }
        if (local_58 != (QArrayData *)0x0) {
          LOCK();
          (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_58,2,0x10);
          }
        }
      }
      operator_delete__(pvVar8);
      uVar7 = extraout_RAX;
    }
    iVar6 = (int)CONCAT71((int7)((ulong)uVar7 >> 8),this_00->linked);
  }
LAB_0014da52:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar6;
  }
LAB_0014db1f:
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShaderProgram::link()
{
    Q_D(QOpenGLShaderProgram);
    GLuint program = d->programGuard ? d->programGuard->id() : 0;
    if (!program)
        return false;

    if (!d->linkBinaryRecursion && d->shaders.isEmpty() && !d->binaryProgram.shaders.isEmpty())
        return d->linkBinary();

    GLint value;
    if (d->shaders.isEmpty()) {
        // If there are no explicit shaders, then it is possible that the
        // application added a program binary with glProgramBinaryOES(), or
        // otherwise populated the shaders itself. This is also the case when
        // we are recursively called back from linkBinary() after a successful
        // glProgramBinary(). Check to see if the program is already linked and
        // bail out if so.
        value = 0;
        d->glfuncs->glGetProgramiv(program, GL_LINK_STATUS, &value);
        d->linked = (value != 0);
        if (d->linked)
            return true;
    }

    d->glfuncs->glLinkProgram(program);
    value = 0;
    d->glfuncs->glGetProgramiv(program, GL_LINK_STATUS, &value);
    d->linked = (value != 0);
    value = 0;
    d->glfuncs->glGetProgramiv(program, GL_INFO_LOG_LENGTH, &value);
    d->log = QString();
    if (value > 1) {
        char *logbuf = new char [value];
        GLint len;
        d->glfuncs->glGetProgramInfoLog(program, value, &len, logbuf);
        d->log = QString::fromLatin1(logbuf);
        if (!d->linked && !d->linkBinaryRecursion) {
            QString name = objectName();
            if (name.isEmpty())
                qWarning("QOpenGLShader::link: %ls", qUtf16Printable(d->log));
            else
                qWarning("QOpenGLShader::link[%ls]: %ls", qUtf16Printable(name), qUtf16Printable(d->log));
        }
        delete [] logbuf;
    }
    return d->linked;
}